

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplaceRealloc<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos,
          LoopDim *args)

{
  ulong uVar1;
  pointer p;
  _Storage<slang::ConstantRange,_true> _Var2;
  undefined8 uVar3;
  pointer pLVar4;
  long lVar5;
  pointer pLVar6;
  pointer pLVar7;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar1 = this->cap;
  if (uVar10 < uVar1 * 2) {
    uVar10 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar10 = 0x555555555555555;
  }
  lVar8 = (long)pos - (long)this->data_;
  pLVar4 = (pointer)operator_new(uVar10 * 0x18);
  *(IteratorSymbol **)((long)pLVar4 + lVar8 + 0x10) = args->loopVar;
  _Var2 = *(_Storage<slang::ConstantRange,_true> *)
           &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged;
  *(_Storage<slang::ConstantRange,_true> *)((long)pLVar4 + lVar8) =
       (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ConstantRange>._M_payload;
  ((_Storage<slang::ConstantRange,_true> *)((long)pLVar4 + lVar8))[1] = _Var2;
  p = this->data_;
  sVar9 = this->len;
  lVar5 = (long)p + (sVar9 * 0x18 - (long)pos);
  pLVar6 = p;
  pLVar7 = pLVar4;
  if (lVar5 == 0) {
    pLVar6 = pLVar4;
    pLVar7 = p;
    if (sVar9 != 0) {
      do {
        pLVar6->loopVar = pLVar7->loopVar;
        uVar3 = *(undefined8 *)
                 &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload =
             (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange>._M_payload;
        *(undefined8 *)
         &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
        pLVar7 = pLVar7 + 1;
        pLVar6 = pLVar6 + 1;
      } while (pLVar7 != pos);
    }
  }
  else {
    for (; pLVar6 != pos; pLVar6 = pLVar6 + 1) {
      pLVar7->loopVar = pLVar6->loopVar;
      uVar3 = *(undefined8 *)
               &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
      pLVar7 = pLVar7 + 1;
    }
    memcpy((void *)((long)pLVar4 + lVar8 + 0x18),pos,((lVar5 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar9 = this->len;
  }
  this->len = sVar9 + 1;
  this->cap = uVar10;
  this->data_ = pLVar4;
  return (pointer)((long)pLVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}